

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instdb.cpp
# Opt level: O3

InstId asmjit::v1_14::InstNameUtils::find
                 (char *s,size_t len,InstNameIndex *nameIndex,uint32_t *nameTable,char *stringTable)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  char cVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  char nameData [32];
  
  lVar13 = 0;
  if (s != (char *)0x0) {
    if (len == 0xffffffffffffffff) {
      len = strlen(s);
    }
    if (len - 1 < (ulong)nameIndex->maxNameLength) {
      bVar1 = *s;
      uVar3 = (int)(char)bVar1 - 0x61;
      if (uVar3 < 0x1a) {
        uVar12 = (ulong)nameIndex->data[uVar3].start;
        lVar13 = 0;
        if (uVar12 != 0) {
          uVar11 = nameIndex->data[uVar3].end - uVar12;
          if (uVar11 != 0) {
            do {
              uVar14 = uVar11 >> 1;
              lVar13 = uVar14 + uVar12;
              uVar3 = nameTable[lVar13];
              if ((int)uVar3 < 0) {
                uVar10 = 0;
                do {
                  uVar9 = uVar3 & 0x1f;
                  if (uVar9 == 0) goto LAB_0010fbc2;
                  cVar6 = (char)uVar9 + '`';
                  if (0x1a < uVar9) {
                    cVar6 = (char)uVar9 + '\x15';
                  }
                  nameData[uVar10] = cVar6;
                  uVar10 = uVar10 + 1;
                  uVar3 = uVar3 >> 5;
                } while (uVar10 != 6);
                uVar10 = 6;
              }
              else {
                uVar9 = uVar3 >> 0xc & 0xf;
                uVar10 = (ulong)uVar9;
                if (uVar9 != 0) {
                  memcpy(nameData,stringTable + (uVar3 & 0xfff),uVar10);
                }
                if (0xfffffff < uVar3) {
                  memcpy(nameData + uVar10,stringTable + (uVar3 >> 0x10 & 0xfff),
                         (ulong)(uVar3 >> 0x1c));
                }
                uVar10 = uVar10 + (uVar3 >> 0x1c);
              }
LAB_0010fbc2:
              uVar4 = len;
              if (uVar10 < len) {
                uVar4 = uVar10;
              }
              if (uVar4 == 0) {
                iVar8 = (int)len - (int)uVar10;
              }
              else if (bVar1 == nameData[0]) {
                uVar5 = 1;
                bVar7 = bVar1;
                uVar3 = (int)(char)bVar1;
                if (uVar4 != 1) {
                  do {
                    bVar7 = s[uVar5];
                    uVar3 = (uint)(byte)nameData[uVar5];
                    if (bVar7 != nameData[uVar5]) break;
                    uVar5 = uVar5 + 1;
                    uVar3 = (uint)bVar7;
                  } while (uVar4 != uVar5);
                }
                iVar8 = (int)len - (int)uVar10;
                if (uVar5 < uVar4) {
                  iVar8 = (uint)bVar7 - (uVar3 & 0xff);
                }
              }
              else {
                iVar8 = (uint)bVar1 - (uint)(byte)nameData[0];
              }
              if (-1 < iVar8) {
                if (iVar8 == 0) goto LAB_0010fc50;
                uVar12 = lVar13 + 1;
                uVar11 = uVar11 - 1;
                uVar14 = uVar11 >> 1;
              }
              bVar2 = 1 < uVar11;
              uVar11 = uVar14;
            } while (bVar2);
          }
          lVar13 = 0;
        }
      }
    }
  }
LAB_0010fc50:
  return (InstId)lVar13;
}

Assistant:

InstId find(const char* s, size_t len, const InstNameIndex& nameIndex, const uint32_t* nameTable, const char* stringTable) noexcept {
  if (ASMJIT_UNLIKELY(!s))
    return BaseInst::kIdNone;

  if (len == SIZE_MAX)
    len = strlen(s);

  if (ASMJIT_UNLIKELY(len == 0 || len > nameIndex.maxNameLength))
    return BaseInst::kIdNone;

  uint32_t prefix = uint32_t(s[0]) - 'a';
  if (ASMJIT_UNLIKELY(prefix > 'z' - 'a'))
    return BaseInst::kIdNone;

  size_t base = nameIndex.data[prefix].start;
  size_t end = nameIndex.data[prefix].end;

  if (ASMJIT_UNLIKELY(!base))
    return BaseInst::kIdNone;

  char nameData[kBufferSize];
  for (size_t lim = end - base; lim != 0; lim >>= 1) {
    size_t instId = base + (lim >> 1);
    size_t nameSize = decodeToBuffer(nameData, nameTable[instId], stringTable);

    int result = Support::compareStringViews(s, len, nameData, nameSize);
    if (result < 0)
      continue;

    if (result > 0) {
      base = instId + 1;
      lim--;
      continue;
    }

    return InstId(instId);
  }

  return BaseInst::kIdNone;
}